

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_1b0fcc::Db::parseBracedExpr(Db *this)

{
  char *pcVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  char cVar6;
  NameState *in_RSI;
  
  pcVar1 = this->First;
  if ((this->Last != pcVar1) && (*pcVar1 == 'd')) {
    if ((ulong)((long)this->Last - (long)pcVar1) < 2) {
      cVar6 = '\0';
    }
    else {
      cVar6 = pcVar1[1];
    }
    if (cVar6 == 'X') {
      this->First = pcVar1 + 2;
      pNVar2 = parseExpr(this);
      if (((pNVar2 != (Node *)0x0) && (pNVar3 = parseExpr(this), pNVar3 != (Node *)0x0)) &&
         (pNVar4 = parseBracedExpr(this), pNVar4 != (Node *)0x0)) {
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar5->K = KBracedRangeExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018d018;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar2;
        *(Node **)&pNVar5[1].K = pNVar3;
        pNVar5[2]._vptr_Node = (_func_int **)pNVar4;
        return pNVar5;
      }
    }
    else if (cVar6 == 'x') {
      this->First = pcVar1 + 2;
      pNVar2 = parseExpr(this);
      if ((pNVar2 != (Node *)0x0) && (pNVar3 = parseBracedExpr(this), pNVar3 != (Node *)0x0)) {
        pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar4->K = KBracedExpr;
        pNVar4->RHSComponentCache = No;
        pNVar4->ArrayCache = No;
        pNVar4->FunctionCache = No;
        pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018cfc0;
        pNVar4[1]._vptr_Node = (_func_int **)pNVar2;
        *(Node **)&pNVar4[1].K = pNVar3;
        *(undefined1 *)&pNVar4[2]._vptr_Node = 1;
        return pNVar4;
      }
    }
    else {
      if (cVar6 != 'i') goto LAB_0015ae62;
      this->First = pcVar1 + 2;
      pNVar2 = parseSourceName(this,in_RSI);
      if ((pNVar2 != (Node *)0x0) && (pNVar3 = parseBracedExpr(this), pNVar3 != (Node *)0x0)) {
        pNVar4 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar4->K = KBracedExpr;
        pNVar4->RHSComponentCache = No;
        pNVar4->ArrayCache = No;
        pNVar4->FunctionCache = No;
        pNVar4->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0018cfc0;
        pNVar4[1]._vptr_Node = (_func_int **)pNVar2;
        *(Node **)&pNVar4[1].K = pNVar3;
        *(undefined1 *)&pNVar4[2]._vptr_Node = 0;
        return pNVar4;
      }
    }
    return (Node *)0x0;
  }
LAB_0015ae62:
  pNVar2 = parseExpr(this);
  return pNVar2;
}

Assistant:

Node *Db::parseBracedExpr() {
  if (look() == 'd') {
    switch (look(1)) {
    case 'i': {
      First += 2;
      Node *Field = parseSourceName(/*NameState=*/nullptr);
      if (Field == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Field, Init, /*isArray=*/false);
    }
    case 'x': {
      First += 2;
      Node *Index = parseExpr();
      if (Index == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Index, Init, /*isArray=*/true);
    }
    case 'X': {
      First += 2;
      Node *RangeBegin = parseExpr();
      if (RangeBegin == nullptr)
        return nullptr;
      Node *RangeEnd = parseExpr();
      if (RangeEnd == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedRangeExpr>(RangeBegin, RangeEnd, Init);
    }
    }
  }
  return parseExpr();
}